

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tinyexr.h
# Opt level: O2

mz_bool mz_zip_writer_add_file
                  (mz_zip_archive *pZip,char *pArchive_name,char *pSrc_filename,void *pComment,
                  mz_uint16 comment_size,mz_uint level_and_flags)

{
  mz_uint16 mVar1;
  size_t sVar2;
  mz_uint64 mVar3;
  undefined1 uVar4;
  mz_bool mVar5;
  mz_uint mVar6;
  int iVar7;
  tdefl_status tVar8;
  FILE *__stream;
  tdefl_compressor *ptVar9;
  size_t sVar10;
  mz_uint8 *pmVar11;
  tdefl_compressor *ptVar12;
  long lVar13;
  ushort uVar14;
  void *pvVar15;
  uint uVar16;
  tdefl_compressor *ptVar17;
  mz_uint64 mVar18;
  mz_uint16 dos_date_00;
  mz_uint64 in_stack_fffffffffffffed8;
  mz_ulong uncomp_size;
  mz_uint16 dos_date;
  mz_uint16 dos_time;
  tdefl_compressor *local_108;
  tdefl_compressor *local_100;
  mz_uint8 *local_f8;
  tdefl_compressor *local_f0;
  size_t local_e8;
  mz_uint64 local_e0;
  ulong local_d8;
  void *local_d0;
  mz_zip_writer_add_state state;
  time_t local_70;
  
  dos_time = 0;
  dos_date = 0;
  uVar16 = 6;
  if (-1 < (int)level_and_flags) {
    uVar16 = level_and_flags;
  }
  if (pZip->m_pState == (mz_zip_internal_state *)0x0) {
    return 0;
  }
  if (pArchive_name == (char *)0x0) {
    return 0;
  }
  if (pZip->m_zip_mode != MZ_ZIP_MODE_WRITING) {
    return 0;
  }
  if ((uVar16 >> 10 & 1) != 0) {
    return 0;
  }
  if (pComment == (void *)0x0 && comment_size != 0) {
    return 0;
  }
  if (10 < (uVar16 & 0xf)) {
    return 0;
  }
  mVar18 = pZip->m_archive_size;
  local_d0 = pComment;
  mVar5 = (anonymous_namespace)::miniz::mz_zip_writer_validate_archive_name(pArchive_name);
  if (mVar5 == 0) {
    return 0;
  }
  local_e8 = strlen(pArchive_name);
  if (0xffff < local_e8) {
    return 0;
  }
  if (pZip->m_total_files == 0xffff) {
    return 0;
  }
  mVar6 = (anonymous_namespace)::miniz::mz_zip_writer_compute_padding_needed_for_file_alignment
                    (pZip);
  local_e0 = mVar18 + mVar6;
  local_d8 = (ulong)comment_size;
  if (local_e8 + local_d8 + local_e0 + 0x4c >> 0x20 != 0) {
    return 0;
  }
  iVar7 = stat64(pSrc_filename,(stat64 *)&state);
  if (iVar7 != 0) {
    return 0;
  }
  (anonymous_namespace)::miniz::mz_zip_time_to_dos_time(local_70,&dos_time,&dos_date);
  __stream = fopen64(pSrc_filename,"rb");
  if (__stream == (FILE *)0x0) {
    return 0;
  }
  fseeko64(__stream,0,2);
  ptVar9 = (tdefl_compressor *)ftello64(__stream);
  fseeko64(__stream,0,0);
  if ((ulong)ptVar9 >> 0x20 != 0) {
    fclose(__stream);
    return 0;
  }
  uVar16 = uVar16 & 0xf;
  if (ptVar9 < (tdefl_compressor *)0x4) {
    uVar16 = 0;
  }
  lVar13 = (ulong)mVar6 + 0x1e;
  local_100 = ptVar9;
  mVar5 = (anonymous_namespace)::miniz::mz_zip_writer_write_zeros(pZip,mVar18,(mz_uint32)lVar13);
  sVar2 = local_e8;
  if (mVar5 == 0) goto LAB_0019dce9;
  if ((pZip->m_file_offset_alignment != 0) &&
     (((uint)local_e0 & pZip->m_file_offset_alignment - 1) != 0)) {
    __assert_fail("(local_dir_header_ofs & (pZip->m_file_offset_alignment - 1)) == 0",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/15462-f16[P]Scotty3D/CMU462/include/CMU462/tinyexr.h"
                  ,0x1864,
                  "mz_bool (anonymous namespace)::miniz::mz_zip_writer_add_file(mz_zip_archive *, const char *, const char *, const void *, mz_uint16, mz_uint)"
                 );
  }
  mVar18 = lVar13 + mVar18;
  sVar10 = (*pZip->m_pWrite)(pZip->m_pIO_opaque,mVar18,pArchive_name,local_e8);
  if (sVar10 != sVar2) goto LAB_0019dce9;
  mVar18 = mVar18 + sVar2;
  if (local_100 == (tdefl_compressor *)0x0) {
    ptVar9 = (tdefl_compressor *)0x0;
    uVar14 = 0;
    uncomp_size = 0;
    goto LAB_0019ddc0;
  }
  pmVar11 = (mz_uint8 *)(*pZip->m_pAlloc)(pZip->m_pAlloc_opaque,1,0x10000);
  if (pmVar11 == (mz_uint8 *)0x0) goto LAB_0019dce9;
  local_f8 = pmVar11;
  if (uVar16 != 0) {
    ptVar9 = (tdefl_compressor *)(*pZip->m_pAlloc)(pZip->m_pAlloc_opaque,1,0x4df78);
    if (ptVar9 != (tdefl_compressor *)0x0) {
      state.m_comp_size = 0;
      uncomp_size = 0;
      state.m_pZip = pZip;
      state.m_cur_archive_file_ofs = mVar18;
      mVar6 = tdefl_create_comp_flags_from_zip_params(uVar16,-0xf,0);
      local_108 = ptVar9;
      tdefl_init(ptVar9,(anonymous_namespace)::miniz::mz_zip_writer_add_put_buf_callback,&state,
                 mVar6);
      pmVar11 = local_f8;
      ptVar9 = local_100;
      do {
        ptVar17 = (tdefl_compressor *)0x10000;
        if (ptVar9 < (tdefl_compressor *)0x10000) {
          ptVar17 = ptVar9;
        }
        ptVar12 = (tdefl_compressor *)fread(pmVar11,1,(size_t)ptVar17,__stream);
        local_f0 = (tdefl_compressor *)CONCAT71(local_f0._1_7_,ptVar12 != ptVar17);
        if (ptVar12 != ptVar17) goto LAB_0019dcc1;
        uncomp_size = mz_crc32(uncomp_size & 0xffffffff,pmVar11,(size_t)ptVar17);
        ptVar9 = (tdefl_compressor *)((long)ptVar9 - (long)ptVar17);
        tVar8 = tdefl_compress_buffer
                          (local_108,pmVar11,(size_t)ptVar17,
                           (uint)(ptVar9 == (tdefl_compressor *)0x0) << 2);
      } while (tVar8 == TDEFL_STATUS_OKAY);
      if (tVar8 != TDEFL_STATUS_DONE) {
        local_f0 = (tdefl_compressor *)CONCAT71(local_f0._1_7_,1);
      }
LAB_0019dcc1:
      (*pZip->m_pFree)(pZip->m_pAlloc_opaque,local_108);
      if ((char)local_f0 == '\0') {
        uVar14 = 8;
        ptVar9 = (tdefl_compressor *)state.m_comp_size;
        mVar18 = state.m_cur_archive_file_ofs;
        goto LAB_0019ddb4;
      }
    }
    pvVar15 = pZip->m_pAlloc_opaque;
    pmVar11 = local_f8;
LAB_0019dd90:
    (*pZip->m_pFree)(pvVar15,pmVar11);
LAB_0019dce9:
    fclose(__stream);
    return 0;
  }
  uncomp_size = 0;
  ptVar9 = local_100;
  while (ptVar9 != (tdefl_compressor *)0x0) {
    ptVar17 = (tdefl_compressor *)0x10000;
    if (ptVar9 < (tdefl_compressor *)0x10000) {
      ptVar17 = ptVar9;
    }
    local_108 = ptVar9;
    ptVar9 = (tdefl_compressor *)fread(pmVar11,1,(size_t)ptVar17,__stream);
    if ((ptVar9 != ptVar17) ||
       (ptVar9 = (tdefl_compressor *)
                 (*pZip->m_pWrite)(pZip->m_pIO_opaque,mVar18,pmVar11,(size_t)ptVar17),
       ptVar9 != ptVar17)) {
      pvVar15 = pZip->m_pAlloc_opaque;
      goto LAB_0019dd90;
    }
    uncomp_size = mz_crc32(uncomp_size & 0xffffffff,pmVar11,(size_t)ptVar17);
    mVar18 = (long)ptVar17->m_max_probes + (mVar18 - 0x14);
    ptVar9 = (tdefl_compressor *)((long)local_108 - (long)ptVar17);
  }
  uVar14 = 0;
  ptVar9 = local_100;
LAB_0019ddb4:
  (*pZip->m_pFree)(pZip->m_pAlloc_opaque,local_f8);
LAB_0019ddc0:
  fclose(__stream);
  mVar3 = local_e0;
  mVar1 = dos_time;
  if ((ulong)ptVar9 >> 0x20 != 0) {
    return 0;
  }
  if (mVar18 >> 0x20 != 0) {
    return 0;
  }
  uVar4 = 0x14;
  if (uVar14 == 0) {
    uVar4 = 0;
  }
  state.m_pZip = (mz_zip_archive *)CONCAT35(0,CONCAT14(uVar4,0x4034b50));
  local_108 = (tdefl_compressor *)CONCAT44(local_108._4_4_,(uint)dos_date);
  state.m_cur_archive_file_ofs =
       CONCAT17((char)(uncomp_size >> 8),
                CONCAT16((char)uncomp_size,
                         CONCAT15((char)(dos_date >> 8),
                                  CONCAT14((char)dos_date,
                                           CONCAT13((char)(dos_time >> 8),
                                                    CONCAT12((char)dos_time,uVar14))))));
  state.m_comp_size =
       CONCAT17((char)((ulong)local_100 >> 8),
                CONCAT16((char)local_100,
                         CONCAT15((char)((ulong)ptVar9 >> 0x18),
                                  CONCAT14((char)((ulong)ptVar9 >> 0x10),
                                           CONCAT13((char)((ulong)ptVar9 >> 8),
                                                    CONCAT12((char)ptVar9,
                                                             (short)(uncomp_size >> 0x10)))))));
  dos_date_00 = 0xdeb1;
  local_f0 = ptVar9;
  sVar10 = (*pZip->m_pWrite)(pZip->m_pIO_opaque,local_e0,&state,0x1e);
  if (sVar10 != 0x1e) {
    return 0;
  }
  mVar5 = (anonymous_namespace)::miniz::mz_zip_writer_add_to_central_dir
                    (pZip,pArchive_name,(mz_uint16)local_e8,local_d0,(mz_uint16)local_d8,local_100,
                     (mz_uint16)local_f0,uncomp_size,(ulong)uVar14,(uint)mVar1,(mz_uint16)local_108,
                     (mz_uint16)mVar3,0,dos_date_00,in_stack_fffffffffffffed8,(mz_uint32)uncomp_size
                    );
  if (mVar5 == 0) {
    return 0;
  }
  pZip->m_total_files = pZip->m_total_files + 1;
  pZip->m_archive_size = mVar18;
  return 1;
}

Assistant:

mz_bool mz_zip_writer_add_file(mz_zip_archive *pZip, const char *pArchive_name,
                               const char *pSrc_filename, const void *pComment,
                               mz_uint16 comment_size,
                               mz_uint level_and_flags) {
  mz_uint uncomp_crc32 = MZ_CRC32_INIT, level, num_alignment_padding_bytes;
  mz_uint16 method = 0, dos_time = 0, dos_date = 0, ext_attributes = 0;
  mz_uint64 local_dir_header_ofs = pZip->m_archive_size,
            cur_archive_file_ofs = pZip->m_archive_size, uncomp_size = 0,
            comp_size = 0;
  size_t archive_name_size;
  mz_uint8 local_dir_header[MZ_ZIP_LOCAL_DIR_HEADER_SIZE];
  MZ_FILE *pSrc_file = NULL;

  if ((int)level_and_flags < 0)
    level_and_flags = MZ_DEFAULT_LEVEL;
  level = level_and_flags & 0xF;

  if ((!pZip) || (!pZip->m_pState) ||
      (pZip->m_zip_mode != MZ_ZIP_MODE_WRITING) || (!pArchive_name) ||
      ((comment_size) && (!pComment)) || (level > MZ_UBER_COMPRESSION))
    return MZ_FALSE;
  if (level_and_flags & MZ_ZIP_FLAG_COMPRESSED_DATA)
    return MZ_FALSE;
  if (!mz_zip_writer_validate_archive_name(pArchive_name))
    return MZ_FALSE;

  archive_name_size = strlen(pArchive_name);
  if (archive_name_size > 0xFFFF)
    return MZ_FALSE;

  num_alignment_padding_bytes =
      mz_zip_writer_compute_padding_needed_for_file_alignment(pZip);

  // no zip64 support yet
  if ((pZip->m_total_files == 0xFFFF) ||
      ((pZip->m_archive_size + num_alignment_padding_bytes +
        MZ_ZIP_LOCAL_DIR_HEADER_SIZE + MZ_ZIP_CENTRAL_DIR_HEADER_SIZE +
        comment_size + archive_name_size) > 0xFFFFFFFF))
    return MZ_FALSE;

  if (!mz_zip_get_file_modified_time(pSrc_filename, &dos_time, &dos_date))
    return MZ_FALSE;

  pSrc_file = MZ_FOPEN(pSrc_filename, "rb");
  if (!pSrc_file)
    return MZ_FALSE;
  MZ_FSEEK64(pSrc_file, 0, SEEK_END);
  uncomp_size = MZ_FTELL64(pSrc_file);
  MZ_FSEEK64(pSrc_file, 0, SEEK_SET);

  if (uncomp_size > 0xFFFFFFFF) {
    // No zip64 support yet
    MZ_FCLOSE(pSrc_file);
    return MZ_FALSE;
  }
  if (uncomp_size <= 3)
    level = 0;

  if (!mz_zip_writer_write_zeros(pZip, cur_archive_file_ofs,
                                 num_alignment_padding_bytes +
                                     sizeof(local_dir_header))) {
    MZ_FCLOSE(pSrc_file);
    return MZ_FALSE;
  }
  local_dir_header_ofs += num_alignment_padding_bytes;
  if (pZip->m_file_offset_alignment) {
    MZ_ASSERT((local_dir_header_ofs & (pZip->m_file_offset_alignment - 1)) ==
              0);
  }
  cur_archive_file_ofs +=
      num_alignment_padding_bytes + sizeof(local_dir_header);

  MZ_CLEAR_OBJ(local_dir_header);
  if (pZip->m_pWrite(pZip->m_pIO_opaque, cur_archive_file_ofs, pArchive_name,
                     archive_name_size) != archive_name_size) {
    MZ_FCLOSE(pSrc_file);
    return MZ_FALSE;
  }
  cur_archive_file_ofs += archive_name_size;

  if (uncomp_size) {
    mz_uint64 uncomp_remaining = uncomp_size;
    void *pRead_buf =
        pZip->m_pAlloc(pZip->m_pAlloc_opaque, 1, MZ_ZIP_MAX_IO_BUF_SIZE);
    if (!pRead_buf) {
      MZ_FCLOSE(pSrc_file);
      return MZ_FALSE;
    }

    if (!level) {
      while (uncomp_remaining) {
        mz_uint n = (mz_uint)MZ_MIN(MZ_ZIP_MAX_IO_BUF_SIZE, uncomp_remaining);
        if ((MZ_FREAD(pRead_buf, 1, n, pSrc_file) != n) ||
            (pZip->m_pWrite(pZip->m_pIO_opaque, cur_archive_file_ofs, pRead_buf,
                            n) != n)) {
          pZip->m_pFree(pZip->m_pAlloc_opaque, pRead_buf);
          MZ_FCLOSE(pSrc_file);
          return MZ_FALSE;
        }
        uncomp_crc32 =
            (mz_uint32)mz_crc32(uncomp_crc32, (const mz_uint8 *)pRead_buf, n);
        uncomp_remaining -= n;
        cur_archive_file_ofs += n;
      }
      comp_size = uncomp_size;
    } else {
      mz_bool result = MZ_FALSE;
      mz_zip_writer_add_state state;
      tdefl_compressor *pComp = (tdefl_compressor *)pZip->m_pAlloc(
          pZip->m_pAlloc_opaque, 1, sizeof(tdefl_compressor));
      if (!pComp) {
        pZip->m_pFree(pZip->m_pAlloc_opaque, pRead_buf);
        MZ_FCLOSE(pSrc_file);
        return MZ_FALSE;
      }

      state.m_pZip = pZip;
      state.m_cur_archive_file_ofs = cur_archive_file_ofs;
      state.m_comp_size = 0;

      if (tdefl_init(pComp, mz_zip_writer_add_put_buf_callback, &state,
                     tdefl_create_comp_flags_from_zip_params(
                         level, -15, MZ_DEFAULT_STRATEGY)) !=
          TDEFL_STATUS_OKAY) {
        pZip->m_pFree(pZip->m_pAlloc_opaque, pComp);
        pZip->m_pFree(pZip->m_pAlloc_opaque, pRead_buf);
        MZ_FCLOSE(pSrc_file);
        return MZ_FALSE;
      }

      for (;;) {
        size_t in_buf_size =
            (mz_uint32)MZ_MIN(uncomp_remaining, MZ_ZIP_MAX_IO_BUF_SIZE);
        tdefl_status status;

        if (MZ_FREAD(pRead_buf, 1, in_buf_size, pSrc_file) != in_buf_size)
          break;

        uncomp_crc32 = (mz_uint32)mz_crc32(
            uncomp_crc32, (const mz_uint8 *)pRead_buf, in_buf_size);
        uncomp_remaining -= in_buf_size;

        status = tdefl_compress_buffer(pComp, pRead_buf, in_buf_size,
                                       uncomp_remaining ? TDEFL_NO_FLUSH
                                                        : TDEFL_FINISH);
        if (status == TDEFL_STATUS_DONE) {
          result = MZ_TRUE;
          break;
        } else if (status != TDEFL_STATUS_OKAY)
          break;
      }

      pZip->m_pFree(pZip->m_pAlloc_opaque, pComp);

      if (!result) {
        pZip->m_pFree(pZip->m_pAlloc_opaque, pRead_buf);
        MZ_FCLOSE(pSrc_file);
        return MZ_FALSE;
      }

      comp_size = state.m_comp_size;
      cur_archive_file_ofs = state.m_cur_archive_file_ofs;

      method = MZ_DEFLATED;
    }

    pZip->m_pFree(pZip->m_pAlloc_opaque, pRead_buf);
  }

  MZ_FCLOSE(pSrc_file);
  pSrc_file = NULL;

  // no zip64 support yet
  if ((comp_size > 0xFFFFFFFF) || (cur_archive_file_ofs > 0xFFFFFFFF))
    return MZ_FALSE;

  if (!mz_zip_writer_create_local_dir_header(
          pZip, local_dir_header, (mz_uint16)archive_name_size, 0, uncomp_size,
          comp_size, uncomp_crc32, method, 0, dos_time, dos_date))
    return MZ_FALSE;

  if (pZip->m_pWrite(pZip->m_pIO_opaque, local_dir_header_ofs, local_dir_header,
                     sizeof(local_dir_header)) != sizeof(local_dir_header))
    return MZ_FALSE;

  if (!mz_zip_writer_add_to_central_dir(
          pZip, pArchive_name, (mz_uint16)archive_name_size, NULL, 0, pComment,
          comment_size, uncomp_size, comp_size, uncomp_crc32, method, 0,
          dos_time, dos_date, local_dir_header_ofs, ext_attributes))
    return MZ_FALSE;

  pZip->m_total_files++;
  pZip->m_archive_size = cur_archive_file_ofs;

  return MZ_TRUE;
}